

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void percent_rankStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  char *pcVar1;
  
  if ((short)pCtx->pMem->flags < 0) {
    pcVar1 = pCtx->pMem->z;
  }
  else {
    pcVar1 = (char *)createAggContext(pCtx,0x18);
  }
  if (pcVar1 != (char *)0x0) {
    *(long *)(pcVar1 + 0x10) = *(long *)(pcVar1 + 0x10) + 1;
  }
  return;
}

Assistant:

static void percent_rankStepFunc(
  sqlite3_context *pCtx,
  int nArg,
  sqlite3_value **apArg
){
  struct CallCount *p;
  UNUSED_PARAMETER(nArg); assert( nArg==0 );
  UNUSED_PARAMETER(apArg);
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    p->nTotal++;
  }
}